

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>>
::_find_key<std::__cxx11::string>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          size_t hashval)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  pointer __s2;
  size_t sVar5;
  size_t __n;
  uint uVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  int iVar24;
  uint uVar25;
  size_t sVar26;
  ulong uVar27;
  long lVar28;
  size_t unaff_R15;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i match;
  long local_80;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  
  lVar2 = *(long *)this;
  sVar26 = 0xffffffffffffffff;
  if (lVar2 != 0) {
    uVar3 = *(ulong *)(this + 0x18);
    if ((uVar3 + 1 & uVar3) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar27 = hashval >> 7 & uVar3;
    auVar31 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar31 = pshuflw(auVar31,auVar31,0);
    lVar4 = *(long *)(this + 8);
    __s2 = (key->_M_dataplus)._M_p;
    sVar5 = key->_M_string_length;
    local_80 = 0;
    do {
      pcVar1 = (char *)(lVar2 + uVar27);
      cVar8 = *pcVar1;
      cVar9 = pcVar1[1];
      cVar10 = pcVar1[2];
      cVar11 = pcVar1[3];
      cVar12 = pcVar1[4];
      cVar13 = pcVar1[5];
      cVar14 = pcVar1[6];
      cVar15 = pcVar1[7];
      cVar16 = pcVar1[8];
      cVar17 = pcVar1[9];
      cVar18 = pcVar1[10];
      cVar19 = pcVar1[0xb];
      cVar20 = pcVar1[0xc];
      cVar21 = pcVar1[0xd];
      cVar22 = pcVar1[0xe];
      cVar23 = pcVar1[0xf];
      local_58 = auVar31[0];
      cStack_57 = auVar31[1];
      cStack_56 = auVar31[2];
      cStack_55 = auVar31[3];
      auVar32[0] = -(local_58 == cVar8);
      auVar32[1] = -(cStack_57 == cVar9);
      auVar32[2] = -(cStack_56 == cVar10);
      auVar32[3] = -(cStack_55 == cVar11);
      auVar32[4] = -(local_58 == cVar12);
      auVar32[5] = -(cStack_57 == cVar13);
      auVar32[6] = -(cStack_56 == cVar14);
      auVar32[7] = -(cStack_55 == cVar15);
      auVar32[8] = -(local_58 == cVar16);
      auVar32[9] = -(cStack_57 == cVar17);
      auVar32[10] = -(cStack_56 == cVar18);
      auVar32[0xb] = -(cStack_55 == cVar19);
      auVar32[0xc] = -(local_58 == cVar20);
      auVar32[0xd] = -(cStack_57 == cVar21);
      auVar32[0xe] = -(cStack_56 == cVar22);
      auVar32[0xf] = -(cStack_55 == cVar23);
      uVar7 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
      iVar24 = 4;
      bVar29 = uVar7 == 0;
      sVar26 = unaff_R15;
      if (!bVar29) {
        uVar25 = (uint)uVar7;
        do {
          uVar6 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          sVar26 = uVar6 + uVar27 & uVar3;
          __n = *(size_t *)(lVar4 + 8 + sVar26 * 0x20);
          if (__n == sVar5) {
            if (__n == 0) {
              bVar30 = true;
            }
            else {
              iVar24 = bcmp(*(void **)(sVar26 * 0x20 + lVar4),__s2,__n);
              bVar30 = iVar24 == 0;
            }
          }
          else {
            bVar30 = false;
          }
          if (bVar30) {
            iVar24 = 1;
            goto LAB_001570f5;
          }
          uVar25 = uVar25 - 1 & uVar25;
          bVar29 = uVar25 == 0;
        } while (!bVar29);
        iVar24 = 4;
        sVar26 = unaff_R15;
      }
LAB_001570f5:
      if (bVar29) {
        auVar33[0] = -(cVar8 == -0x80);
        auVar33[1] = -(cVar9 == -0x80);
        auVar33[2] = -(cVar10 == -0x80);
        auVar33[3] = -(cVar11 == -0x80);
        auVar33[4] = -(cVar12 == -0x80);
        auVar33[5] = -(cVar13 == -0x80);
        auVar33[6] = -(cVar14 == -0x80);
        auVar33[7] = -(cVar15 == -0x80);
        auVar33[8] = -(cVar16 == -0x80);
        auVar33[9] = -(cVar17 == -0x80);
        auVar33[10] = -(cVar18 == -0x80);
        auVar33[0xb] = -(cVar19 == -0x80);
        auVar33[0xc] = -(cVar20 == -0x80);
        auVar33[0xd] = -(cVar21 == -0x80);
        auVar33[0xe] = -(cVar22 == -0x80);
        auVar33[0xf] = -(cVar23 == -0x80);
        iVar24 = 3;
        if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar33 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar33 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar33 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar33 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar33 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar33 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar33 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar33 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar33 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar33 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar33 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar33[0xf]
           ) {
          lVar28 = uVar27 + local_80;
          local_80 = local_80 + 0x10;
          uVar27 = lVar28 + 0x10U & uVar3;
          iVar24 = 0;
        }
      }
      unaff_R15 = sVar26;
    } while (iVar24 == 0);
    if (iVar24 == 3) {
      sVar26 = 0xffffffffffffffff;
    }
  }
  return sVar26;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }